

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
::
emplace_value<absl::lts_20250127::container_internal::map_slot_type<int,google::protobuf::internal::ExtensionSet::Extension>*>
          (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
           *this,field_type i,allocator_type *alloc,
          map_slot_type<int,_google::protobuf::internal::ExtensionSet::Extension> **args)

{
  btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
  bVar1;
  map_slot_type<int,_google::protobuf::internal::ExtensionSet::Extension> *pmVar2;
  undefined8 uVar3;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar4;
  FieldDescriptor *pFVar5;
  byte bVar6;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *c;
  uint uVar7;
  undefined7 in_register_00000031;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  bVar6 = btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)this);
  if (i < bVar6) {
    __assert_fail("i >= start()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x709,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>, Args = <absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension> *>]"
                 );
  }
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  bVar1 = this[10];
  if ((byte)bVar1 < i) {
    __assert_fail("i <= finish()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x70a,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>, Args = <absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension> *>]"
                 );
  }
  iVar8 = (int)CONCAT71(in_register_00000031,i);
  if (i < (byte)bVar1) {
    btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
    ::transfer_n_backward
              ((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *)this,(long)(int)((uint)(byte)bVar1 - iVar8),(ulong)(iVar8 + 1),(ulong)i,
               (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *)this,alloc);
    bVar1 = this[10];
  }
  uVar7 = (uint)(byte)bVar1;
  pmVar2 = *args;
  uVar3 = *(undefined8 *)pmVar2;
  aVar4 = (pmVar2->value).second.field_0;
  pFVar5 = (pmVar2->value).second.descriptor;
  *(undefined8 *)(this + (ulong)i * 0x20 + 0x20) = *(undefined8 *)&(pmVar2->value).second.type;
  *(FieldDescriptor **)(this + (ulong)i * 0x20 + 0x20 + 8) = pFVar5;
  *(undefined8 *)(this + (ulong)i * 0x20 + 0x10) = uVar3;
  *(anon_union_8_9_fdc4a54a_for_Extension_0 *)(this + (ulong)i * 0x20 + 0x10 + 8) = aVar4;
  this[10] = (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
              )((char)bVar1 + 1U);
  if ((this[0xb] ==
       (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
        )0x0) && (uVar9 = iVar8 + 1, uVar9 < (byte)((char)bVar1 + 1U))) {
    do {
      uVar10 = uVar7 & 0xff;
      c = btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::child((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)this,(field_type)uVar7);
      btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      ::set_child((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)this,(field_type)uVar7 + '\x01',c);
      uVar7 = uVar10 - 1;
    } while (uVar9 < uVar10);
    btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
    ::mutable_child((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)this,(field_type)uVar9);
    return;
  }
  return;
}

Assistant:

inline void btree_node<P>::emplace_value(const field_type i,
                                         allocator_type *alloc,
                                         Args &&...args) {
  assert(i >= start());
  assert(i <= finish());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < finish()) {
    transfer_n_backward(finish() - i, /*dest_i=*/i + 1, /*src_i=*/i, this,
                        alloc);
  }
  value_init(static_cast<field_type>(i), alloc, std::forward<Args>(args)...);
  set_finish(finish() + 1);

  if (is_internal() && finish() > i + 1) {
    for (field_type j = finish(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}